

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O1

bool tcu::bilinearCompare
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
               PixelBufferAccess *errorMask,RGBA threshold)

{
  bool bVar1;
  InternalError *this;
  bool bVar2;
  int y;
  int x;
  string local_50;
  
  if (((reference->m_format).order == RGBA) && ((reference->m_format).type == UNORM_INT8)) {
    local_50._M_dataplus._M_p = (pointer)0x3f80000000000000;
    local_50._M_string_length = 0x3f80000000000000;
    clear(errorMask,(Vec4 *)&local_50);
    if ((reference->m_size).m_data[1] < 1) {
      bVar2 = true;
    }
    else {
      y = 0;
      bVar2 = true;
      do {
        if (0 < (reference->m_size).m_data[0]) {
          x = 0;
          do {
            bVar1 = anon_unknown_0::comparePixelRGBA8(reference,result,threshold,x,y);
            if ((!bVar1) &&
               (bVar1 = anon_unknown_0::comparePixelRGBA8(result,reference,threshold,x,y), !bVar1))
            {
              local_50._M_dataplus._M_p = (pointer)0x3f800000;
              local_50._M_string_length = 0x3f80000000000000;
              bVar2 = false;
              PixelBufferAccess::setPixel(errorMask,(Vec4 *)&local_50,x,y,0);
            }
            x = x + 1;
          } while (x < (reference->m_size).m_data[0]);
        }
        y = y + 1;
      } while (y < (reference->m_size).m_data[1]);
    }
    return bVar2;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Unsupported format for bilinear comparison","");
  InternalError::InternalError(this,&local_50);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

bool bilinearCompare (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const PixelBufferAccess& errorMask, const RGBA threshold)
{
	DE_ASSERT(reference.getWidth()	== result.getWidth()	&&
			  reference.getHeight()	== result.getHeight()	&&
			  reference.getDepth()	== result.getDepth()	&&
			  reference.getFormat()	== result.getFormat());
	DE_ASSERT(reference.getWidth()	== errorMask.getWidth()		&&
			  reference.getHeight()	== errorMask.getHeight()	&&
			  reference.getDepth()	== errorMask.getDepth());

	if (reference.getFormat() == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
		return bilinearCompareRGBA8(reference, result, errorMask, threshold);
	else
		throw InternalError("Unsupported format for bilinear comparison");
}